

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cpp
# Opt level: O1

bool MeCab::Dictionary::compile
               (Param *param,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *dics,char *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  int *piVar4;
  pointer ppVar5;
  pointer ppVar6;
  size_type sVar7;
  istringstream *piVar8;
  Param *__file;
  bool bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ostream *poVar15;
  POSIDGenerator *this;
  pointer pbVar16;
  long *plVar17;
  size_t sVar18;
  unit_t *puVar19;
  DecoderFeatureIndex *pDVar20;
  CharProperty *this_00;
  DictionaryRewriter *pDVar21;
  ContextID *p;
  Token *pTVar22;
  _Rb_tree_header *p_Var23;
  Node *node_00;
  int extraout_EDX;
  int extraout_EDX_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar24;
  unit_t *puVar25;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  *ppVar26;
  unit_t *puVar27;
  char *pcVar28;
  unit_t *puVar29;
  long lVar30;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *pDVar31;
  unit_t *puVar32;
  DecoderFeatureIndex *pDVar33;
  ulong uVar34;
  char *tmpstr;
  vector<const_char_*,_std::allocator<const_char_*>_> str;
  int type;
  string prev;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  dic;
  vector<unsigned_long,_std::allocator<unsigned_long>_> len;
  scoped_ptr<MeCab::DictionaryRewriter> rewrite;
  uint lexsize;
  vector<int,_std::allocator<int>_> val;
  string tbuf;
  char charset [32];
  scoped_ptr<MeCab::ContextID> cid;
  Iconv config_iconv;
  uint version;
  uint fsize;
  uint tsize;
  uint dsize;
  uint rsize;
  uint lsize;
  uint dummy;
  Iconv iconv;
  string from;
  string fbuf;
  string dicdir;
  string config_charset;
  string node_format;
  string to;
  string right_id_file;
  string left_id_file;
  ofstream bofs;
  string rewrite_file;
  DoubleArray da;
  Node node;
  string pos_id_file;
  string matrix_bin_file;
  string matrix_file;
  Connector matrix;
  istringstream iss;
  StringBuffer *local_9e0;
  CharProperty *local_9d8;
  Writer *local_9d0;
  Lattice *local_9c8;
  die local_9ae;
  die local_9ad;
  die local_9ac;
  die local_9ab;
  die local_9aa;
  die local_9a9;
  unit_t *local_9a8;
  DecoderFeatureIndex *local_9a0;
  string local_998;
  uint local_978;
  int local_974;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
  local_970;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  local_948;
  string local_928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_908;
  scoped_ptr<MeCab::DictionaryRewriter> local_900;
  int local_8f0;
  int local_8ec;
  vector<int,_std::allocator<int>_> local_8e8;
  string local_8c8;
  string local_8a8;
  scoped_ptr<MeCab::ContextID> local_880;
  long local_870;
  istringstream *local_868;
  Iconv local_860;
  int local_850;
  undefined4 local_84c;
  undefined4 local_848;
  undefined4 local_844;
  int local_840;
  uint local_83c;
  uint local_838 [2];
  long local_830;
  Param *local_828;
  Iconv local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  undefined1 *local_7f0;
  undefined8 local_7e8;
  undefined1 local_7e0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  char *local_7b0;
  ulong local_7a8;
  _func_int **local_7a0;
  _func_int **local_798;
  _func_int **local_790;
  _func_int **local_788;
  _func_int **local_780;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738;
  string local_718;
  string local_6f8;
  undefined1 local_6d8 [8];
  size_type sStack_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6c8;
  byte abStack_6b8 [216];
  ios_base local_5e0 [280];
  string local_4c8;
  DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> local_4a8;
  Node local_448;
  string local_3d0;
  string local_3b0;
  string local_390;
  Connector local_370;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_908 = dics;
  Connector::Connector(&local_370);
  local_900._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_001400e0;
  local_900.ptr_ = (DictionaryRewriter *)0x0;
  local_880._vptr_scoped_ptr = (_func_int **)&PTR__scoped_ptr_00140110;
  local_880.ptr_ = (ContextID *)0x0;
  Param::get<std::__cxx11::string>(&local_7d0,param,"dicdir");
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"matrix.def","");
  create_filename(&local_390,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"matrix.bin","");
  create_filename(&local_3b0,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"left-id.def","");
  create_filename(&local_6f8,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"right-id.def","");
  create_filename(&local_718,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"rewrite.def","");
  create_filename(&local_4c8,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6d8,"pos-id.def","");
  create_filename(&local_3d0,&local_7d0,(string *)local_6d8);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  local_948.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_948.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
        *)0x0;
  local_948.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>
        *)0x0;
  local_8ec = 0;
  local_7f0 = local_7e0;
  local_7e8 = 0;
  local_7e0[0] = 0;
  Param::get<std::__cxx11::string>(&local_810,param,"dictionary-charset");
  Param::get<std::__cxx11::string>(&local_738,param,"charset");
  bVar9 = Param::get<bool>(param,"wakati");
  local_974 = Param::get<int>(param,"type");
  Param::get<std::__cxx11::string>(&local_758,param,"node-format");
  iVar11 = Param::get<int>(param,"cost-factor");
  if (iVar11 < 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"factor > 0",10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"cost factor needs to be positive value",0x26);
    die::~die((die *)local_6d8);
  }
  Param::get<std::__cxx11::string>(&local_778,param,"config-charset");
  if (local_778._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_778);
  }
  if (local_810._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x118);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!from.empty()",0xd);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"input dictionary charset is empty",0x21);
    die::~die((die *)local_6d8);
  }
  if (local_738._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x119);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"!to.empty()",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"output dictionary charset is empty",0x22);
    die::~die((die *)local_6d8);
  }
  Iconv::Iconv(&local_820);
  iVar12 = Iconv::open(&local_820,local_810._M_dataplus._M_p,(int)local_738._M_dataplus._M_p);
  if ((char)iVar12 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"iconv.open(from.c_str(), to.c_str())",0x24);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"iconv_open() failed with from=",0x1e);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_810._M_dataplus._M_p,local_810._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," to=",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,local_738._M_dataplus._M_p,local_738._M_string_length);
    die::~die(&local_9a9);
  }
  local_7b0 = output;
  Iconv::Iconv(&local_860);
  iVar12 = Iconv::open(&local_860,local_778._M_dataplus._M_p,(int)local_810._M_dataplus._M_p);
  if ((char)iVar12 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x120);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"config_iconv.open(config_charset.c_str(), from.c_str())",0x37);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"iconv_open() failed with from=",0x1e);
    poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_778._M_dataplus._M_p,local_778._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15," to=",4);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,local_810._M_dataplus._M_p,local_810._M_string_length);
    die::~die(&local_9aa);
  }
  if (local_758._M_string_length == 0) {
    local_9e0 = (StringBuffer *)0x0;
    local_9c8 = (Lattice *)0x0;
    local_9d0 = (Writer *)0x0;
  }
  else {
    local_9d0 = (Writer *)operator_new(0x200);
    Writer::Writer(local_9d0);
    local_9c8 = createLattice();
    local_9e0 = (StringBuffer *)operator_new(0x28);
    local_9e0->_vptr_StringBuffer = (_func_int **)&PTR__StringBuffer_0013ffc0;
    local_9e0->size_ = 0;
    local_9e0->alloc_size_ = 0;
    local_9e0->ptr_ = (char *)0x0;
    local_9e0->is_delete_ = true;
    local_9e0->error_ = false;
    local_448.wcost = 0;
    local_448._98_6_ = 0;
    local_448.cost = 0;
    local_448.isbest = '\0';
    local_448._81_3_ = 0;
    local_448.alpha = 0.0;
    local_448.beta = 0.0;
    local_448.prob = 0.0;
    local_448.id = 0;
    local_448.length = 0;
    local_448.rlength = 0;
    local_448.rcAttr = 0;
    local_448.lcAttr = 0;
    local_448.posid = 0;
    local_448.char_type = '\0';
    local_448.stat = '\0';
    local_448.surface = (pointer)0x0;
    local_448.feature = (char *)0x0;
    local_448.rpath = (mecab_path_t *)0x0;
    local_448.lpath = (mecab_path_t *)0x0;
    local_448.enext = (mecab_node_t *)0x0;
    local_448.bnext = (mecab_node_t *)0x0;
    local_448.prev = (mecab_node_t *)0x0;
    local_448.next = (mecab_node_t *)0x0;
  }
  bVar10 = Connector::openText(&local_370,local_390._M_dataplus._M_p);
  if ((!bVar10) &&
     (iVar12 = Connector::open(&local_370,local_3b0._M_dataplus._M_p,0x130afb), (char)iVar12 == '\0'
     )) {
    local_370.lsize_ = 1;
    local_370.rsize_ = 1;
  }
  this = (POSIDGenerator *)operator_new(0x18);
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rewrite_).super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
  super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  POSIDGenerator::open(this,local_3d0._M_dataplus._M_p,(int)&local_860);
  local_6d8 = (undefined1  [8])&local_6c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_6d8,"DEFAULT,0,0,0,*\nSPACE,0,0,0,*\n","");
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)local_6d8,_S_in);
  if (local_6d8 != (undefined1  [8])&local_6c8) {
    operator_delete((void *)local_6d8);
  }
  pbVar16 = (local_908->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_908->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar16) {
    local_9d8 = (CharProperty *)0x0;
    pDVar33 = (DecoderFeatureIndex *)0x0;
  }
  else {
    local_780 = (_func_int **)&PTR___cxa_pure_virtual_0013feb8;
    local_788 = (_func_int **)&PTR__ChunkFreeList_0013ff30;
    local_790 = (_func_int **)&PTR__ChunkFreeList_0013ff00;
    local_798 = (_func_int **)&PTR__StringBuffer_0013ffc0;
    local_7a0 = (_func_int **)&PTR_open_0013fe48;
    local_870 = 0;
    uVar34 = 0;
    pDVar33 = (DecoderFeatureIndex *)0x0;
    local_9d8 = (CharProperty *)0x0;
    local_850 = iVar11;
    local_828 = param;
    do {
      local_7a8 = uVar34;
      std::ifstream::ifstream((istringstream *)local_6d8,pbVar16[uVar34]._M_dataplus._M_p,_S_in);
      local_868 = (istringstream *)local_6d8;
      if ((abStack_6b8[*(long *)((long)local_6d8 + -0x18)] & 5) != 0) {
        if (local_974 == 2) {
          pbVar16 = (local_908->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,pbVar16[uVar34]._M_dataplus._M_p,
                               pbVar16[uVar34]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15," is not found. minimum setting is used.",0x27);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
          std::ostream::put((char)poVar15);
          std::ostream::flush();
          local_868 = local_1b0;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13e);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"ifs",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"no such file or directory: ",0x1b);
          pbVar16 = (local_908->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,pbVar16[uVar34]._M_dataplus._M_p,pbVar16[uVar34]._M_string_length);
          die::~die((die *)&local_4a8);
          local_868 = (istringstream *)local_6d8;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
      pbVar16 = (local_908->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pbVar16[uVar34]._M_dataplus._M_p,
                           pbVar16[uVar34]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15," ... ",5);
      local_9a8 = (unit_t *)operator_new__(0x2000);
      local_830 = 0;
      while( true ) {
        piVar8 = local_868;
        std::ios::widen((char)*(undefined8 *)(*(long *)local_868 + -0x18) + (char)local_868);
        plVar17 = (long *)std::istream::getline((char *)piVar8,(long)local_9a8,'\0');
        puVar32 = local_9a8;
        if ((*(byte *)((long)plVar17 + *(long *)(*plVar17 + -0x18) + 0x20) & 5) != 0) break;
        sVar18 = strlen((char *)local_9a8);
        if ((sVar18 != 0) && (*(char *)((long)puVar32 + (sVar18 - 1)) == '\r')) {
          *(undefined1 *)((long)puVar32 + (sVar18 - 1)) = 0;
        }
        sVar18 = strlen((char *)puVar32);
        if ((long)sVar18 < 1) {
LAB_001192e8:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x158);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"n == 5",6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"format error: ",0xe);
          puVar32 = local_9a8;
          sVar18 = strlen((char *)local_9a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,(char *)puVar32,sVar18);
          die::~die((die *)&local_970);
        }
        else {
          puVar25 = (unit_t *)((long)&local_9a8->base + sVar18);
          uVar34 = 5;
          lVar30 = 0;
          pDVar31 = &local_4a8;
          puVar32 = local_9a8;
          local_9a0 = pDVar33;
          do {
            for (; (cVar2 = (char)puVar32->base, cVar2 == '\t' || (cVar2 == ' '));
                puVar32 = (unit_t *)((long)&puVar32->base + 1)) {
            }
            if (cVar2 == '\"') {
              puVar32 = (unit_t *)((long)&puVar32->base + 1);
              puVar27 = puVar32;
              for (puVar19 = puVar32;
                  (puVar29 = puVar19, puVar19 < puVar25 &&
                  (((char)puVar19->base != '\"' ||
                   (puVar29 = (unit_t *)((long)&puVar19->base + 1), piVar4 = &puVar19->base,
                   puVar19 = puVar29, *(char *)((long)piVar4 + 1) == '\"'))));
                  puVar19 = (unit_t *)((long)&puVar19->base + 1)) {
                *(char *)&puVar27->base = (char)puVar19->base;
                puVar27 = (unit_t *)((long)&puVar27->base + 1);
              }
              local_970.first._M_dataplus._M_p._0_1_ = 0x2c;
              puVar19 = (unit_t *)
                        std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (puVar29,puVar25,&local_970);
            }
            else {
              local_970.first._M_dataplus._M_p._0_1_ = 0x2c;
              puVar19 = (unit_t *)
                        std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                  (puVar32,puVar25,&local_970);
              puVar27 = puVar19;
            }
            if (1 < uVar34) {
              *(char *)&puVar27->base = '\0';
            }
            uVar34 = uVar34 - 1;
            pDVar31->array_ = puVar32;
            lVar30 = lVar30 + 1;
            if (uVar34 == 0) break;
            pDVar31 = (DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>
                       *)&pDVar31->used_;
            puVar32 = (unit_t *)((long)&puVar19->base + 1);
          } while (puVar32 < puVar25);
          pDVar33 = local_9a0;
          if (lVar30 != 5) goto LAB_001192e8;
        }
        std::__cxx11::string::string
                  ((string *)&local_8c8,(char *)local_4a8.array_,(allocator *)&local_970);
        uVar14 = 0x7fffffff;
        uVar13 = 0x7fffffff;
        if ((local_4a8.used_ != (uchar *)0x0) && (*local_4a8.used_ != '\0')) {
          uVar13 = atoi((char *)local_4a8.used_);
        }
        if (((char *)local_4a8.size_ != (char *)0x0) && (*(char *)local_4a8.size_ != '\0')) {
          uVar14 = atoi((char *)local_4a8.size_);
        }
        local_9a0 = (DecoderFeatureIndex *)CONCAT44(local_9a0._4_4_,0x7fffffff);
        if (((char *)local_4a8.alloc_size_ != (char *)0x0) &&
           (*(char *)local_4a8.alloc_size_ != '\0')) {
          iVar11 = atoi((char *)local_4a8.alloc_size_);
          local_9a0 = (DecoderFeatureIndex *)CONCAT44(local_9a0._4_4_,iVar11);
        }
        std::__cxx11::string::string
                  ((string *)&local_8a8,(char *)local_4a8.key_,(allocator *)&local_970);
        local_8f0 = POSIDGenerator::id(this,local_8a8._M_dataplus._M_p);
        if ((int)local_9a0 == 0x7fffffff) {
          if (local_974 != 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                       ,0x70);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x162);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"type == MECAB_USR_DIC",0x15)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"cost field should not be empty in sys/unk dic.",0x2e);
            die::~die((die *)&local_970);
          }
          if (local_900.ptr_ == (DictionaryRewriter *)0x0) {
            pDVar21 = (DictionaryRewriter *)operator_new(0x78);
            p_Var23 = &(pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var23->_M_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var23->_M_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            scoped_ptr<MeCab::DictionaryRewriter>::reset(&local_900,pDVar21);
            DictionaryRewriter::open(local_900.ptr_,local_4c8._M_dataplus._M_p,(int)&local_860);
            pDVar20 = (DecoderFeatureIndex *)operator_new(0x378);
            (pDVar20->super_FeatureIndex)._vptr_FeatureIndex = local_780;
            (pDVar20->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_freelist_._vptr_ChunkFreeList = local_788;
            (pDVar20->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_int_*>,_std::allocator<std::pair<unsigned_long,_int_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).feature_freelist_.pi_ = 0;
            (pDVar20->super_FeatureIndex).feature_freelist_.li_ = 0;
            (pDVar20->super_FeatureIndex).feature_freelist_.default_size = 0x40000;
            (pDVar20->super_FeatureIndex).char_freelist_._vptr_ChunkFreeList = local_790;
            (pDVar20->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).char_freelist_.freelist_.
            super__Vector_base<std::pair<unsigned_long,_char_*>,_std::allocator<std::pair<unsigned_long,_char_*>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).char_freelist_.pi_ = 0;
            (pDVar20->super_FeatureIndex).char_freelist_.li_ = 0;
            (pDVar20->super_FeatureIndex).char_freelist_.default_size = 0x40000;
            p_Var23 = &(pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.
                       super__Rb_tree_header;
            (pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_color = _S_red;
            (pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_parent = (_Base_ptr)0x0;
            (pDVar20->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).unigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).bigram_templs_.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.unigram_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.left_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.right_rewrite_.
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_left = &p_Var23->_M_header;
            (pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_header._M_right = &p_Var23->_M_header;
            (pDVar20->super_FeatureIndex).rewrite_.cache_._M_t._M_impl.super__Rb_tree_header.
            _M_node_count = 0;
            (pDVar20->super_FeatureIndex).os_._vptr_StringBuffer = local_798;
            (pDVar20->super_FeatureIndex).os_.size_ = 0;
            (pDVar20->super_FeatureIndex).os_.alloc_size_ = 0;
            (pDVar20->super_FeatureIndex).os_.ptr_ = (char *)0x0;
            (pDVar20->super_FeatureIndex).os_.is_delete_ = true;
            (pDVar20->super_FeatureIndex).os_.error_ = false;
            (pDVar20->super_FeatureIndex).maxid_ = 0;
            (pDVar20->super_FeatureIndex).alpha_ = (double *)0x0;
            (pDVar20->super_FeatureIndex)._vptr_FeatureIndex = local_7a0;
            Mmap<char>::Mmap(&pDVar20->mmap_);
            (pDVar20->model_buffer_)._M_dataplus._M_p = (pointer)&(pDVar20->model_buffer_).field_2;
            (pDVar20->model_buffer_)._M_string_length = 0;
            (pDVar20->model_buffer_).field_2._M_local_buf[0] = '\0';
            if (pDVar33 != (DecoderFeatureIndex *)0x0) {
              (*(pDVar33->super_FeatureIndex)._vptr_FeatureIndex[5])(pDVar33);
            }
            iVar11 = (**(pDVar20->super_FeatureIndex)._vptr_FeatureIndex)(pDVar20,local_828);
            if ((char)iVar11 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x168);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"fi->open(param)",0xf);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"cannot open feature index",0x19);
              die::~die(&local_9ab);
            }
            this_00 = (CharProperty *)operator_new(0x1d8);
            CharProperty::CharProperty(this_00);
            __file = local_828;
            iVar11 = extraout_EDX;
            if (local_9d8 != (CharProperty *)0x0) {
              (*local_9d8->_vptr_CharProperty[1])();
              iVar11 = extraout_EDX_00;
            }
            iVar11 = CharProperty::open(this_00,(char *)__file,iVar11);
            if ((char)iVar11 == '\0') {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x16a);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,"property->open(param)",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              die::~die(&local_9ac);
            }
            CharProperty::set_charset(this_00,local_810._M_dataplus._M_p);
            local_9d8 = this_00;
            pDVar33 = pDVar20;
          }
          iVar11 = anon_unknown_0::calcCost
                             (&local_8c8,&local_8a8,local_850,pDVar33,local_900.ptr_,local_9d8);
          local_9a0 = (DecoderFeatureIndex *)CONCAT44(local_9a0._4_4_,iVar11);
        }
        if (((uVar14 == 0x7fffffff) || (uVar13 == 0x7fffffff)) || ((int)(uVar14 | uVar13) < 0)) {
          if (local_900.ptr_ == (DictionaryRewriter *)0x0) {
            pDVar21 = (DictionaryRewriter *)operator_new(0x78);
            p_Var23 = &(pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->unigram_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->left_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pDVar21->right_rewrite_).
            super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            super__Vector_base<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &p_Var23->_M_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 &p_Var23->_M_header;
            (pDVar21->cache_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            scoped_ptr<MeCab::DictionaryRewriter>::reset(&local_900,pDVar21);
            DictionaryRewriter::open(local_900.ptr_,local_4c8._M_dataplus._M_p,(int)&local_860);
          }
          local_970.first._M_dataplus._M_p = (pointer)&local_970.first.field_2;
          local_970.first._M_string_length = 0;
          local_970.first.field_2._M_local_buf[0] = '\0';
          local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
          local_998._M_string_length = 0;
          local_998.field_2._M_allocated_capacity =
               local_998.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_928._M_dataplus._M_p = (pointer)&local_928.field_2;
          local_928._M_string_length = 0;
          local_928.field_2._M_allocated_capacity =
               local_928.field_2._M_allocated_capacity & 0xffffffffffffff00;
          bVar10 = DictionaryRewriter::rewrite
                             (local_900.ptr_,&local_8a8,&local_970.first,&local_998,&local_928);
          if (!bVar10) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                       ,0x70);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x178);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,"rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature)",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15,"rewrite failed: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar15,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
            if (!bVar10) {
              die::~die(&local_9ad);
            }
          }
          if (local_880.ptr_ == (ContextID *)0x0) {
            p = (ContextID *)operator_new(0xa0);
            p_Var23 = &(p->left_)._M_t._M_impl.super__Rb_tree_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
            (p->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            p_Var23 = &(p->right_)._M_t._M_impl.super__Rb_tree_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var23->_M_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var23->_M_header;
            (p->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            (p->left_bos_)._M_dataplus._M_p = (pointer)&(p->left_bos_).field_2;
            (p->left_bos_)._M_string_length = 0;
            (p->left_bos_).field_2._M_local_buf[0] = '\0';
            (p->right_bos_)._M_dataplus._M_p = (pointer)&(p->right_bos_).field_2;
            (p->right_bos_)._M_string_length = 0;
            (p->right_bos_).field_2._M_local_buf[0] = '\0';
            scoped_ptr<MeCab::ContextID>::reset(&local_880,p);
            ContextID::open(local_880.ptr_,local_6f8._M_dataplus._M_p,
                            (int)local_718._M_dataplus._M_p,&local_860);
            if ((((local_880.ptr_)->left_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                 (ulong)local_370.lsize_) ||
               (((local_880.ptr_)->right_)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
                (ulong)local_370.rsize_)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x180);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,
                         "cid->left_size() == matrix.left_size() && cid->right_size() == matrix.right_size()"
                         ,0x52);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"Context ID files(",0x11);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,local_6f8._M_dataplus._M_p,local_6f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," or ",4);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,local_718._M_dataplus._M_p,local_718._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," may be broken",0xe);
              die::~die((die *)&local_8e8);
            }
          }
          uVar13 = ContextID::lid(local_880.ptr_,local_998._M_dataplus._M_p);
          uVar14 = ContextID::rid(local_880.ptr_,local_928._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_928._M_dataplus._M_p != &local_928.field_2) {
            operator_delete(local_928._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_998._M_dataplus._M_p != &local_998.field_2) {
            operator_delete(local_998._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_970.first._M_dataplus._M_p != &local_970.first.field_2) {
            operator_delete(local_970.first._M_dataplus._M_p);
          }
        }
        if ((((int)(uVar14 | uVar13) < 0) || ((uint)local_370._32_4_ >> 0x10 <= uVar13)) ||
           ((local_370._32_4_ & 0xffff) <= uVar14)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                     ,0x70);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x18b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid)",0x31);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar15,"invalid ids are found lid=",0x1a);
          poVar15 = (ostream *)std::ostream::operator<<((ostream *)poVar15,uVar13);
          std::__ostream_insert<char,std::char_traits<char>>(poVar15," rid=",5);
          std::ostream::operator<<((ostream *)poVar15,uVar14);
          die::~die((die *)&local_970);
        }
        if (local_8c8._M_string_length == 0) {
          lVar30 = 0x26;
          pcVar28 = "empty word is found, discard this line";
LAB_0011a2c6:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar28,lVar30);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
          std::ostream::put(-0x58);
          std::ostream::flush();
        }
        else {
          bVar10 = Iconv::convert(&local_820,&local_8a8);
          lVar30 = 0x28;
          if (!bVar10) {
            pcVar28 = "iconv conversion failed. skip this entry";
            goto LAB_0011a2c6;
          }
          if (local_974 != 2) {
            bVar10 = Iconv::convert(&local_820,&local_8c8);
            pcVar28 = "iconv conversion failed. skip this entry";
            if (!bVar10) goto LAB_0011a2c6;
          }
          if (local_758._M_string_length != 0) {
            local_448.surface = local_8c8._M_dataplus._M_p;
            local_448.feature = local_8a8._M_dataplus._M_p;
            local_448.length = (unsigned_short)local_8c8._M_string_length;
            local_448.rlength = (unsigned_short)local_8c8._M_string_length;
            local_448.posid = (unsigned_short)local_8f0;
            local_448._72_8_ = local_448._72_8_ & 0xffffffffffffff;
            (*local_9c8->_vptr_Lattice[9])();
            if (local_9e0 == (StringBuffer *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"os.get()",8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              die::~die((die *)&local_970);
            }
            if (local_9d0 == (Writer *)0x0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"writer.get()",0xc);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              die::~die((die *)&local_970);
            }
            local_9e0->size_ = 0;
            node_00 = &local_448;
            bVar10 = Writer::writeNode(local_9d0,local_9c8,local_758._M_dataplus._M_p,node_00,
                                       local_9e0);
            pvVar24 = extraout_RDX;
            if (!bVar10) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
                         ,0x70);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
              poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ac);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,
                         "writer->writeNode(lattice.get(), node_format.c_str(), &node, &*os)",0x42);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15,"conversion error: ",0x12);
              poVar15 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar15,local_8a8._M_dataplus._M_p,local_8a8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar15," with ",6);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar15,local_758._M_dataplus._M_p,local_758._M_string_length);
              pvVar24 = extraout_RDX_00;
              if (!bVar10) {
                die::~die(&local_9ae);
                pvVar24 = extraout_RDX_01;
              }
            }
            StringBuffer::write(local_9e0,0,pvVar24,(size_t)node_00);
            sVar7 = local_8a8._M_string_length;
            pcVar28 = (char *)0x0;
            if (local_9e0->error_ == false) {
              pcVar28 = local_9e0->ptr_;
            }
            strlen(pcVar28);
            std::__cxx11::string::_M_replace((ulong)&local_8a8,0,(char *)sVar7,(ulong)pcVar28);
          }
          local_998._M_dataplus._M_p = (pointer)&local_998.field_2;
          local_998._M_string_length = 0;
          local_998.field_2._M_allocated_capacity =
               local_998.field_2._M_allocated_capacity & 0xffffffffffffff00;
          if (!bVar9) {
            local_970.first._M_dataplus._M_p = (pointer)&local_970.first.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_970,local_8a8._M_dataplus._M_p,
                       (char *)(local_8a8._M_string_length + (long)local_8a8._M_dataplus._M_p));
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_970,local_970.first._M_string_length,0,'\x01');
            std::__cxx11::string::operator=((string *)&local_998,(string *)&local_970);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_970.first._M_dataplus._M_p != &local_970.first.field_2) {
              operator_delete(local_970.first._M_dataplus._M_p);
            }
          }
          pTVar22 = (Token *)operator_new(0x10);
          pTVar22->lcAttr = (unsigned_short)uVar13;
          pTVar22->rcAttr = (unsigned_short)uVar14;
          pTVar22->posid = (unsigned_short)local_8f0;
          pTVar22->wcost = (short)local_9a0;
          pTVar22->feature = (uint)local_870;
          pTVar22->compound = 0;
          local_970.first._M_dataplus._M_p = (pointer)&local_970.first.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_970,local_8c8._M_dataplus._M_p,
                     local_8c8._M_dataplus._M_p + local_8c8._M_string_length);
          local_970.second = pTVar22;
          std::
          vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
          ::emplace_back<std::pair<std::__cxx11::string,MeCab::Token*>>
                    ((vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>
                      *)&local_948,&local_970);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_970.first._M_dataplus._M_p != &local_970.first.field_2) {
            operator_delete(local_970.first._M_dataplus._M_p);
          }
          if (!bVar9) {
            std::__cxx11::string::append((char *)&local_7f0,(ulong)local_998._M_dataplus._M_p);
          }
          local_8ec = local_8ec + 1;
          local_870 = local_870 + local_998._M_string_length;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_998._M_dataplus._M_p != &local_998.field_2) {
            operator_delete(local_998._M_dataplus._M_p);
          }
          local_830 = local_830 + 1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8a8._M_dataplus._M_p != &local_8a8.field_2) {
          operator_delete(local_8a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
          operator_delete(local_8c8._M_dataplus._M_p);
        }
      }
      poVar15 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar15 + -0x18) + (char)poVar15);
      std::ostream::put((char)poVar15);
      std::ostream::flush();
      operator_delete__(local_9a8);
      std::ifstream::~ifstream(local_6d8);
      uVar34 = local_7a8 + 1;
      pbVar16 = (local_908->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar34 < (ulong)((long)(local_908->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16 >> 5
                             ));
  }
  if (bVar9) {
    std::__cxx11::string::append((char *)&local_7f0,0x131e08);
  }
  ppVar6 = local_948.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_948.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar30 = ((long)local_948.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_948.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                         *)local_6d8,
                        (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>
                         )local_948.
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar30 - (lVar30 + 1 >> 0x3f)) + 1 >> 1);
    if (local_6c8._M_allocated_capacity == 0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                (ppVar5,ppVar6);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,MeCab::Token*>*,std::vector<std::pair<std::__cxx11::string,MeCab::Token*>,std::allocator<std::pair<std::__cxx11::string,MeCab::Token*>>>>,std::pair<std::__cxx11::string,MeCab::Token*>*,long,__gnu_cxx::__ops::_Iter_comp_iter<MeCab::(anonymous_namespace)::pair_1st_cmp<std::__cxx11::string,MeCab::Token*>>>
                (ppVar5,ppVar6,local_6c8._M_allocated_capacity,sStack_6d0);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>
                *)local_6d8);
  }
  local_970.first._M_dataplus._M_p = (pointer)&local_970.first.field_2;
  iVar11 = 0;
  local_970.first._M_string_length = 0;
  local_970.first.field_2._M_local_buf[0] = '\0';
  local_998.field_2._M_allocated_capacity = 0;
  local_998._M_dataplus._M_p = (pointer)0x0;
  local_998._M_string_length = 0;
  local_928.field_2._M_allocated_capacity = 0;
  local_928._M_dataplus._M_p = (pointer)0x0;
  local_928._M_string_length = 0;
  local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (value_type_conflict1 *)0x0;
  local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_9a0 = pDVar33;
  if (local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_9a8 = (unit_t *)0x0;
  }
  else {
    lVar30 = 0;
    uVar34 = 0;
    local_9a8 = (unit_t *)0x0;
    iVar11 = 0;
    do {
      ppVar5 = local_948.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((uVar34 == 0) ||
         ((local_970.first._M_string_length ==
           *(size_t *)
            ((long)&((local_948.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->first)._M_string_length + lVar30)
          && ((local_970.first._M_string_length == 0 ||
              (iVar12 = bcmp(local_970.first._M_dataplus._M_p,
                             *(void **)((long)&((local_948.
                                                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->first).
                                               _M_dataplus._M_p + lVar30),
                             local_970.first._M_string_length), iVar12 == 0)))))) {
        iVar11 = iVar11 + 1;
      }
      else {
        puVar32 = local_9a8;
        local_6d8 = (undefined1  [8])ppVar5[(long)local_9a8].first._M_dataplus._M_p;
        if (local_998._M_string_length == local_998.field_2._M_allocated_capacity) {
          std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&local_998,
                     (iterator)local_998._M_string_length,(char **)local_6d8);
        }
        else {
          *(undefined1 (*) [8])local_998._M_string_length = local_6d8;
          local_998._M_string_length = local_998._M_string_length + 8;
        }
        local_6d8 = (undefined1  [8])
                    local_948.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)puVar32].first._M_string_length;
        if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_928,
                     (iterator)local_928._M_string_length,(unsigned_long *)local_6d8);
        }
        else {
          *(undefined1 (*) [8])local_928._M_string_length = local_6d8;
          local_928._M_string_length = local_928._M_string_length + 8;
        }
        iVar11 = iVar11 + (int)local_9a8 * 0x100;
        local_6d8._0_4_ = iVar11;
        if (local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_8e8,
                     (iterator)
                     local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)local_6d8);
        }
        else {
          *local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = iVar11;
          local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        iVar11 = 1;
        local_9a8 = (unit_t *)uVar34;
      }
      std::__cxx11::string::_M_assign((string *)&local_970);
      uVar34 = uVar34 + 1;
      lVar30 = lVar30 + 0x28;
    } while (uVar34 < (ulong)(((long)local_948.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_948.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  puVar32 = local_9a8;
  local_6d8 = (undefined1  [8])
              local_948.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)local_9a8].first._M_dataplus._M_p;
  if (local_998._M_string_length == local_998.field_2._M_allocated_capacity) {
    std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_998,
               (iterator)local_998._M_string_length,(char **)local_6d8);
  }
  else {
    *(undefined1 (*) [8])local_998._M_string_length = local_6d8;
    local_998._M_string_length = local_998._M_string_length + 8;
  }
  local_6d8 = (undefined1  [8])
              local_948.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)puVar32].first._M_string_length;
  if (local_928._M_string_length == local_928.field_2._M_allocated_capacity) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_928,
               (iterator)local_928._M_string_length,(unsigned_long *)local_6d8);
  }
  else {
    *(undefined1 (*) [8])local_928._M_string_length = local_6d8;
    local_928._M_string_length = local_928._M_string_length + 8;
  }
  iVar11 = iVar11 + (int)local_9a8 * 0x100;
  local_6d8._0_4_ = iVar11;
  if (local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_8e8,
               (iterator)
               local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)local_6d8);
  }
  else {
    *local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = iVar11;
    local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  if (local_998._M_string_length - (long)local_998._M_dataplus._M_p !=
      local_928._M_string_length - (long)local_928._M_dataplus._M_p) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1eb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"str.size() == len.size()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    die::~die((die *)local_6d8);
  }
  if ((long)(local_998._M_string_length - (long)local_998._M_dataplus._M_p) >> 3 !=
      (long)local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start >> 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1ec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"str.size() == val.size()",0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    die::~die((die *)local_6d8);
  }
  local_4a8.no_delete_ = false;
  local_4a8.error_ = 0;
  local_4a8.array_ = (unit_t *)0x0;
  local_4a8.used_ = (uchar *)0x0;
  local_4a8.size_ = 0;
  local_4a8.alloc_size_ = 0;
  iVar11 = Darts::
           DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
           build(&local_4a8,
                 (long)(local_998._M_string_length - (long)local_998._M_dataplus._M_p) >> 3,
                 (key_type_conflict **)local_998._M_dataplus._M_p,
                 (size_t *)local_928._M_dataplus._M_p,
                 local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,anon_unknown_0::progress_bar_darts);
  if (iVar11 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,
               "da.build(str.size(), const_cast<char **>(&str[0]), &len[0], &val[0], &progress_bar_darts) == 0"
               ,0x5e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar15,"unkown error in building double-array",0x25);
    die::~die((die *)local_6d8);
  }
  paVar1 = &local_8c8.field_2;
  local_8c8._M_string_length = 0;
  local_8c8.field_2._M_local_buf[0] = '\0';
  local_8c8._M_dataplus._M_p = (pointer)paVar1;
  if (local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar30 = 0x20;
    uVar34 = 0;
    do {
      std::__cxx11::string::append
                ((char *)&local_8c8,
                 *(ulong *)((long)&((local_948.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                   _M_p + lVar30));
      pvVar24 = *(void **)((long)&((local_948.
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus.
                                  _M_p + lVar30);
      if (pvVar24 != (void *)0x0) {
        operator_delete(pvVar24);
      }
      uVar34 = uVar34 + 1;
      lVar30 = lVar30 + 0x28;
    } while (uVar34 < (ulong)(((long)local_948.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_948.
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  pcVar28 = local_7b0;
  ppVar6 = local_948.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar5 = local_948.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar26 = local_948.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_948.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pcVar3 = (ppVar26->first)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != &(ppVar26->first).field_2) {
        operator_delete(pcVar3);
      }
      ppVar26 = ppVar26 + 1;
    } while (ppVar26 != ppVar6);
    local_948.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar5;
  }
  local_844 = (undefined4)local_8c8._M_string_length;
  if ((local_8c8._M_string_length & 7) != 0) {
    do {
      local_6d8 = (undefined1  [8])0x0;
      sStack_6d0 = 0;
      std::__cxx11::string::append((char *)&local_8c8,(ulong)local_6d8);
      local_844 = (undefined4)local_8c8._M_string_length;
    } while ((local_8c8._M_string_length & 7) != 0);
  }
  local_838[1] = 0;
  local_838[0] = local_370._32_4_ & 0xffff;
  local_83c = (uint)local_370._32_4_ >> 0x10;
  local_840 = (int)local_4a8.size_ << 3;
  local_848 = (undefined4)local_7e8;
  local_84c = 0x66;
  local_8a8.field_2._M_allocated_capacity = 0;
  local_8a8.field_2._8_8_ = 0;
  local_8a8._M_dataplus._M_p = (pointer)0x0;
  local_8a8._M_string_length = 0;
  strncpy((char *)&local_8a8,local_738._M_dataplus._M_p,0x1f);
  std::ofstream::ofstream(local_6d8,pcVar28,_S_out|_S_bin);
  if ((abStack_6b8[*(long *)((long)local_6d8 + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/dictionary.cpp"
               ,0x70);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x20f);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,") [",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"bofs",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar15,"permission denied: ",0x13);
    if (pcVar28 == (char *)0x0) {
      std::ios::clear((int)poVar15 + (int)*(undefined8 *)(*(long *)poVar15 + -0x18));
    }
    else {
      sVar18 = strlen(pcVar28);
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,pcVar28,sVar18);
    }
    die::~die((die *)&local_978);
  }
  local_978 = 0;
  std::ostream::write(local_6d8,(long)&local_978);
  std::ostream::write(local_6d8,(long)&local_84c);
  std::ostream::write(local_6d8,(long)&local_974);
  std::ostream::write(local_6d8,(long)&local_8ec);
  std::ostream::write(local_6d8,(long)local_838);
  std::ostream::write(local_6d8,(long)&local_83c);
  std::ostream::write(local_6d8,(long)&local_840);
  std::ostream::write(local_6d8,(long)&local_844);
  std::ostream::write(local_6d8,(long)&local_848);
  std::ostream::write(local_6d8,(long)(local_838 + 1));
  std::ostream::write(local_6d8,(long)&local_8a8);
  std::ostream::write(local_6d8,(long)local_4a8.array_);
  std::ostream::write(local_6d8,(long)local_8c8._M_dataplus._M_p);
  std::ostream::write(local_6d8,(long)local_7f0);
  local_978 = std::ostream::tellp();
  local_978 = local_978 ^ 0xef718f77;
  std::ostream::seekp(local_6d8,0,0);
  std::ostream::write(local_6d8,(long)&local_978);
  std::ofstream::close();
  local_6d8 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_6d8 + *(long *)(_VTT + -0x18)) = _memcpy;
  std::filebuf::~filebuf((filebuf *)&sStack_6d0);
  std::ios_base::~ios_base(local_5e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8c8._M_dataplus._M_p);
  }
  Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::clear
            (&local_4a8);
  pDVar33 = local_9a0;
  if (local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (value_type_conflict1 *)0x0) {
    operator_delete(local_8e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((size_t *)local_928._M_dataplus._M_p != (size_t *)0x0) {
    operator_delete(local_928._M_dataplus._M_p);
  }
  if ((key_type_conflict **)local_998._M_dataplus._M_p != (key_type_conflict **)0x0) {
    operator_delete(local_998._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.first._M_dataplus._M_p != &local_970.first.field_2) {
    operator_delete(local_970.first._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  Iconv::~Iconv(&local_860);
  Iconv::~Iconv(&local_820);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  if (local_7f0 != local_7e0) {
    operator_delete(local_7f0);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::Token_*>_>_>
  ::~vector(&local_948);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if (local_9d8 != (CharProperty *)0x0) {
    (*local_9d8->_vptr_CharProperty[1])();
  }
  if (local_9e0 != (StringBuffer *)0x0) {
    (*local_9e0->_vptr_StringBuffer[1])();
  }
  if (local_9c8 != (Lattice *)0x0) {
    (*local_9c8->_vptr_Lattice[0x27])();
  }
  if (local_9d0 != (Writer *)0x0) {
    (*local_9d0->_vptr_Writer[1])();
  }
  scoped_ptr<MeCab::ContextID>::~scoped_ptr(&local_880);
  if (pDVar33 != (DecoderFeatureIndex *)0x0) {
    (*(pDVar33->super_FeatureIndex)._vptr_FeatureIndex[5])(pDVar33);
  }
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this);
  operator_delete(this);
  scoped_ptr<MeCab::DictionaryRewriter>::~scoped_ptr(&local_900);
  Connector::~Connector(&local_370);
  return true;
}

Assistant:

bool Dictionary::compile(const Param &param,
                         const std::vector<std::string> &dics,
                         const char *output) {
  Connector matrix;
  scoped_ptr<DictionaryRewriter> rewrite;
  scoped_ptr<POSIDGenerator> posid;
  scoped_ptr<DecoderFeatureIndex> fi;
  scoped_ptr<ContextID> cid;
  scoped_ptr<Writer> writer;
  scoped_ptr<Lattice> lattice;
  scoped_ptr<StringBuffer> os;
  scoped_ptr<CharProperty> property;
  Node node;

  const std::string dicdir = param.get<std::string>("dicdir");

  const std::string matrix_file     = DCONF(MATRIX_DEF_FILE);
  const std::string matrix_bin_file = DCONF(MATRIX_FILE);
  const std::string left_id_file    = DCONF(LEFT_ID_FILE);
  const std::string right_id_file   = DCONF(RIGHT_ID_FILE);
  const std::string rewrite_file    = DCONF(REWRITE_FILE);
  const std::string pos_id_file     = DCONF(POS_ID_FILE);

  std::vector<std::pair<std::string, Token*> > dic;

  size_t offset  = 0;
  unsigned int lexsize = 0;
  std::string fbuf;

  const std::string from = param.get<std::string>("dictionary-charset");
  const std::string to = param.get<std::string>("charset");
  const bool wakati = param.get<bool>("wakati");
  const int type = param.get<int>("type");
  const std::string node_format = param.get<std::string>("node-format");
  const int factor = param.get<int>("cost-factor");
  CHECK_DIE(factor > 0)   << "cost factor needs to be positive value";

  // for backward compatibility
  std::string config_charset = param.get<std::string>("config-charset");
  if (config_charset.empty()) {
    config_charset = from;
  }

  CHECK_DIE(!from.empty()) << "input dictionary charset is empty";
  CHECK_DIE(!to.empty())   << "output dictionary charset is empty";

  Iconv iconv;
  CHECK_DIE(iconv.open(from.c_str(), to.c_str()))
      << "iconv_open() failed with from=" << from << " to=" << to;

  Iconv config_iconv;
  CHECK_DIE(config_iconv.open(config_charset.c_str(), from.c_str()))
      << "iconv_open() failed with from=" << config_charset << " to=" << from;

  if (!node_format.empty()) {
    writer.reset(new Writer);
    lattice.reset(createLattice());
    os.reset(new StringBuffer);
    memset(&node, 0, sizeof(node));
  }

  if (!matrix.openText(matrix_file.c_str()) &&
      !matrix.open(matrix_bin_file.c_str())) {
    matrix.set_left_size(1);
    matrix.set_right_size(1);
  }

  posid.reset(new POSIDGenerator);
  posid->open(pos_id_file.c_str(), &config_iconv);

  std::istringstream iss(UNK_DEF_DEFAULT);

  for (size_t i = 0; i < dics.size(); ++i) {
    std::ifstream ifs(WPATH(dics[i].c_str()));
    std::istream *is = &ifs;
    if (!ifs) {
      if (type == MECAB_UNK_DIC) {
        std::cerr << dics[i]
                  << " is not found. minimum setting is used." << std::endl;
        is = &iss;
      } else {
        CHECK_DIE(ifs) << "no such file or directory: " << dics[i];
      }
    }

    std::cout << "reading " << dics[i] << " ... ";

    scoped_fixed_array<char, BUF_SIZE> line;
    size_t num = 0;

    while (is->getline(line.get(), line.size())) {
#if 1 /* for Open JTalk */
      {
        /* if there is CR code, it should be removed */
        char *tmpstr = line.get();
        if(tmpstr != NULL){
          size_t tmplen = strlen(tmpstr);
          if(tmplen > 0){
            if(tmpstr[tmplen-1] == '\r'){
              tmpstr[tmplen-1] = '\0';
            }
          }
        }
      }
#endif
      char *col[8];
      const size_t n = tokenizeCSV(line.get(), col, 5);
      CHECK_DIE(n == 5) << "format error: " << line.get();

      std::string w = col[0];
      int lid = toInt(col[1]);
      int rid = toInt(col[2]);
      int cost = toInt(col[3]);
      std::string feature = col[4];
      const int pid = posid->id(feature.c_str());

      if (cost == INT_MAX) {
        CHECK_DIE(type == MECAB_USR_DIC)
            << "cost field should not be empty in sys/unk dic.";
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
          fi.reset(new DecoderFeatureIndex);
          CHECK_DIE(fi->open(param)) << "cannot open feature index";
          property.reset(new CharProperty);
          CHECK_DIE(property->open(param));
          property->set_charset(from.c_str());
        }
        cost = calcCost(w, feature, factor,
                        fi.get(), rewrite.get(), property.get());
      }

      if (lid < 0  || rid < 0 || lid == INT_MAX || rid == INT_MAX) {
        if (!rewrite.get()) {
          rewrite.reset(new DictionaryRewriter);
          rewrite->open(rewrite_file.c_str(), &config_iconv);
        }

        std::string ufeature, lfeature, rfeature;
        CHECK_DIE(rewrite->rewrite(feature, &ufeature, &lfeature, &rfeature))
            << "rewrite failed: " << feature;

        if (!cid.get()) {
          cid.reset(new ContextID);
          cid->open(left_id_file.c_str(),
                    right_id_file.c_str(), &config_iconv);
          CHECK_DIE(cid->left_size()  == matrix.left_size() &&
                    cid->right_size() == matrix.right_size())
              << "Context ID files("
              << left_id_file
              << " or "
              << right_id_file << " may be broken";
        }

        lid = cid->lid(lfeature.c_str());
        rid = cid->rid(rfeature.c_str());
      }

      CHECK_DIE(lid >= 0 && rid >= 0 && matrix.is_valid(lid, rid))
          << "invalid ids are found lid=" << lid << " rid=" << rid;

      if (w.empty()) {
        std::cerr << "empty word is found, discard this line" << std::endl;
        continue;
      }

      if (!iconv.convert(&feature)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (type != MECAB_UNK_DIC && !iconv.convert(&w)) {
        std::cerr << "iconv conversion failed. skip this entry"
                  << std::endl;
        continue;
      }

      if (!node_format.empty()) {
        node.surface = w.c_str();
        node.feature = feature.c_str();
        node.length  = w.size();
        node.rlength = w.size();
        node.posid   = pid;
        node.stat    = MECAB_NOR_NODE;
        lattice->set_sentence(w.c_str());
        CHECK_DIE(os.get());
        CHECK_DIE(writer.get());
        os->clear();
        CHECK_DIE(writer->writeNode(lattice.get(),
                                    node_format.c_str(),
                                    &node, &*os)) <<
            "conversion error: " << feature << " with " << node_format;
        *os << '\0';
        feature = os->str();
      }

      std::string key;
      if (!wakati) {
        key = feature + '\0';
      }

      Token* token  = new Token;
      token->lcAttr = lid;
      token->rcAttr = rid;
      token->posid  = pid;
      token->wcost = cost;
      token->feature = offset;
      token->compound = 0;
      dic.push_back(std::pair<std::string, Token*>(w, token));

      // append to output buffer
      if (!wakati) {
        fbuf.append(key.data(), key.size());
      }
      offset += key.size();

      ++num;
      ++lexsize;
    }

    std::cout << num << std::endl;
  }

  if (wakati) {
    fbuf.append("\0", 1);
  }

  std::stable_sort(dic.begin(), dic.end(),
                   pair_1st_cmp<std::string, Token *>());

  size_t bsize = 0;
  size_t idx = 0;
  std::string prev;
  std::vector<const char *> str;
  std::vector<size_t> len;
  std::vector<Darts::DoubleArray::result_type> val;

  for (size_t i = 0; i < dic.size(); ++i) {
    if (i != 0 && prev != dic[i].first) {
      str.push_back(dic[idx].first.c_str());
      len.push_back(dic[idx].first.size());
      val.push_back(bsize +(idx << 8));
      bsize = 1;
      idx = i;
    } else {
      ++bsize;
    }
    prev = dic[i].first;
  }
  str.push_back(dic[idx].first.c_str());
  len.push_back(dic[idx].first.size());
  val.push_back(bsize +(idx << 8));

  CHECK_DIE(str.size() == len.size());
  CHECK_DIE(str.size() == val.size());

  Darts::DoubleArray da;
  CHECK_DIE(da.build(str.size(), const_cast<char **>(&str[0]),
                     &len[0], &val[0], &progress_bar_darts) == 0)
      << "unkown error in building double-array";

  std::string tbuf;
  for (size_t i = 0; i < dic.size(); ++i) {
    tbuf.append(reinterpret_cast<const char*>(dic[i].second),
                sizeof(Token));
    delete dic[i].second;
  }
  dic.clear();

  // needs to be 8byte(64bit) aligned
  while (tbuf.size() % 8 != 0) {
    Token dummy;
    memset(&dummy, 0, sizeof(Token));
    tbuf.append(reinterpret_cast<const char*>(&dummy), sizeof(Token));
  }

  unsigned int dummy = 0;
  unsigned int lsize = matrix.left_size();
  unsigned int rsize = matrix.right_size();
  unsigned int dsize = da.unit_size() * da.size();
  unsigned int tsize = tbuf.size();
  unsigned int fsize = fbuf.size();

  unsigned int version = DIC_VERSION;
  char charset[32];
  std::fill(charset, charset + sizeof(charset), '\0');
  std::strncpy(charset, to.c_str(), 31);

  std::ofstream bofs(WPATH(output), std::ios::binary|std::ios::out);
  CHECK_DIE(bofs) << "permission denied: " << output;

  unsigned int magic = 0;

  // needs to be 64bit aligned
  // 10*32 = 64*5
  bofs.write(reinterpret_cast<const char *>(&magic),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&version), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&type),    sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lexsize), sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&lsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&rsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&tsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&fsize),   sizeof(unsigned int));
  bofs.write(reinterpret_cast<const char *>(&dummy),   sizeof(unsigned int));

  // 32 * 8 = 64 * 4
  bofs.write(reinterpret_cast<const char *>(charset),  sizeof(charset));

  bofs.write(reinterpret_cast<const char*>(da.array()),
             da.unit_size() * da.size());
  bofs.write(const_cast<const char *>(tbuf.data()), tbuf.size());
  bofs.write(const_cast<const char *>(fbuf.data()), fbuf.size());

  // save magic id
  magic = static_cast<unsigned int>(bofs.tellp());
  magic ^= DictionaryMagicID;
  bofs.seekp(0);
  bofs.write(reinterpret_cast<const char *>(&magic), sizeof(unsigned int));

  bofs.close();

  return true;
}